

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> __thiscall
fmt::v8::detail::
write_int_noinline<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>
          (detail *this,back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,
          write_int_arg<unsigned_long> arg,basic_format_specs<wchar_t> *specs,locale_ref loc)

{
  presentation_type pVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar5;
  uint uVar6;
  basic_format_specs<wchar_t> *specs_00;
  anon_class_16_3_9e397504_for_write_digits local_78;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_68;
  anon_class_40_3_03e05ccd_conflict local_60;
  write_int_data<wchar_t> data;
  
  specs_00 = arg._8_8_;
  pVar1 = specs_00->type;
  uVar4 = (uint)arg.abs_value;
  local_78.abs_value._5_3_ = (undefined3)((ulong)out.container >> 0x28);
  local_78.abs_value._0_5_ = SUB85(out.container,0);
  local_68.container = (buffer<wchar_t> *)this;
  switch(pVar1) {
  case none:
  case dec:
    if (((specs_00->field_0xa & 1) == 0) ||
       (bVar2 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long,wchar_t>
                          (&local_68,(unsigned_long)out.container,uVar4,specs_00,(locale_ref)specs),
       !bVar2)) {
      local_78.num_digits = do_count_digits((uint64_t)out.container);
      bVar5.container = local_68.container;
      if (specs_00->precision == -1 && specs_00->width == 0) {
        to_unsigned<int>(local_78.num_digits);
        if (uVar4 != 0) {
          for (uVar4 = uVar4 & 0xffffff; uVar4 != 0; uVar4 = uVar4 >> 8) {
            local_60.prefix = uVar4 & 0xff;
            buffer<wchar_t>::push_back(bVar5.container,(wchar_t *)&local_60);
          }
        }
        local_68 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1589:41)>
                   ::anon_class_40_3_03e05ccd::anon_class_16_2_2cc2fad2_for_write_digits::operator()
                             ((anon_class_16_2_2cc2fad2_for_write_digits *)&local_78,bVar5.container
                             );
      }
      else {
        write_int_data<wchar_t>::write_int_data(&data,local_78.num_digits,uVar4,specs_00);
        local_60.data.size = data.size;
        local_60.data.padding = data.padding;
        local_60.write_digits.abs_value._0_5_ = (undefined5)local_78.abs_value;
        local_60.write_digits.abs_value._5_3_ = local_78.abs_value._5_3_;
        local_60.write_digits.num_digits = local_78.num_digits;
        local_60.prefix = uVar4;
        local_68 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>
                             (bVar5,specs_00,data.size,(anon_class_40_3_03e05ccd *)&local_60);
      }
    }
    break;
  case oct:
    local_78.num_digits = count_digits<3,unsigned_long>((unsigned_long)out.container);
    if (((specs_00->field_0x9 & 0x80) != 0) &&
       (out.container != (buffer<wchar_t> *)0x0 && specs_00->precision <= local_78.num_digits)) {
      uVar3 = 0x3000;
      if (uVar4 == 0) {
        uVar3 = 0x30;
      }
      uVar4 = (uVar3 | uVar4) + 0x1000000;
    }
    if (specs_00->precision == -1 && specs_00->width == 0) {
      to_unsigned<int>(local_78.num_digits);
      if (uVar4 != 0) {
        for (uVar4 = uVar4 & 0xffffff; uVar4 != 0; uVar4 = uVar4 >> 8) {
          local_60.prefix = uVar4 & 0xff;
          buffer<wchar_t>::push_back((buffer<wchar_t> *)this,(wchar_t *)&local_60);
        }
      }
      local_68 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1622:22)>
                 ::anon_class_40_3_03e05ccd::anon_class_16_2_2cc2fad2_for_write_digits::operator()
                           ((anon_class_16_2_2cc2fad2_for_write_digits *)&local_78,
                            (reserve_iterator<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>_>
                             )this);
    }
    else {
      write_int_data<wchar_t>::write_int_data(&data,local_78.num_digits,uVar4,specs_00);
      local_60.data.size = data.size;
      local_60.data.padding = data.padding;
      local_60.write_digits.abs_value._0_5_ = (undefined5)local_78.abs_value;
      local_60.write_digits.abs_value._5_3_ = local_78.abs_value._5_3_;
      local_60.write_digits.num_digits = local_78.num_digits;
      local_60.prefix = uVar4;
      local_68 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_4_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_4_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>
                           ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)this,specs_00,
                            data.size,(anon_class_40_3_03e05ccd *)&local_60);
    }
    break;
  case hex_lower:
  case hex_upper:
    if ((specs_00->field_0x9 & 0x80) != 0) {
      uVar6 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar3 = uVar6 << 8;
      if (uVar4 == 0) {
        uVar3 = uVar6;
      }
      uVar4 = (uVar3 | uVar4) + 0x2000000;
    }
    local_78.num_digits = count_digits<4,unsigned_long>((unsigned_long)out.container);
    local_78._13_3_ = 0;
    local_78.upper = pVar1 == hex_upper;
    if (specs_00->precision == -1 && specs_00->width == 0) {
      to_unsigned<int>(local_78.num_digits);
      if (uVar4 != 0) {
        for (uVar4 = uVar4 & 0xffffff; uVar4 != 0; uVar4 = uVar4 >> 8) {
          local_60.prefix = uVar4 & 0xff;
          buffer<wchar_t>::push_back((buffer<wchar_t> *)this,(wchar_t *)&local_60);
        }
      }
      local_68 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1600:41)>
                 ::anon_class_40_3_03e05ccd::anon_class_16_3_9e397504_for_write_digits::operator()
                           (&local_78,
                            (reserve_iterator<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>_>
                             )this);
    }
    else {
      write_int_data<wchar_t>::write_int_data(&data,local_78.num_digits,uVar4,specs_00);
      local_60.data.size = data.size;
      local_60.data.padding = data.padding;
      local_60.write_digits.abs_value._0_5_ = (undefined5)local_78.abs_value;
      local_60.write_digits.abs_value._5_3_ = local_78.abs_value._5_3_;
      local_60.write_digits.num_digits = local_78.num_digits;
      local_60.write_digits.upper = local_78.upper;
      local_60.prefix = uVar4;
      local_68 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_2_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_2_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>
                           ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)this,specs_00,
                            data.size,&local_60);
    }
    break;
  case bin_lower:
  case bin_upper:
    if ((specs_00->field_0x9 & 0x80) != 0) {
      uVar6 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar3 = uVar6 << 8;
      if (uVar4 == 0) {
        uVar3 = uVar6;
      }
      uVar4 = (uVar3 | uVar4) + 0x2000000;
    }
    local_78.num_digits = count_digits<1,unsigned_long>((unsigned_long)out.container);
    if (specs_00->precision == -1 && specs_00->width == 0) {
      to_unsigned<int>(local_78.num_digits);
      if (uVar4 != 0) {
        for (uVar4 = uVar4 & 0xffffff; uVar4 != 0; uVar4 = uVar4 >> 8) {
          local_60.prefix = uVar4 & 0xff;
          buffer<wchar_t>::push_back((buffer<wchar_t> *)this,(wchar_t *)&local_60);
        }
      }
      local_68 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1611:22)>
                 ::anon_class_40_3_03e05ccd::anon_class_16_2_2cc2fad2_for_write_digits::operator()
                           ((anon_class_16_2_2cc2fad2_for_write_digits *)&local_78,
                            (reserve_iterator<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>_>
                             )this);
    }
    else {
      write_int_data<wchar_t>::write_int_data(&data,local_78.num_digits,uVar4,specs_00);
      local_60.data.size = data.size;
      local_60.data.padding = data.padding;
      local_60.write_digits.abs_value._0_5_ = (undefined5)local_78.abs_value;
      local_60.write_digits.abs_value._5_3_ = local_78.abs_value._5_3_;
      local_60.write_digits.num_digits = local_78.num_digits;
      local_60.prefix = uVar4;
      local_68 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_3_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_3_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>
                           ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)this,specs_00,
                            data.size,(anon_class_40_3_03e05ccd *)&local_60);
    }
    break;
  default:
    fmt::v8::detail::throw_format_error("invalid type specifier");
  case chr:
    bVar5 = write_char<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                      ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)this,
                       (wchar_t)out.container,specs_00);
    return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar5.container;
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)local_68.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}